

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
 __thiscall
Lib::
Stack<std::unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>_>
::pop(Stack<std::unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>_>
      *this)

{
  unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  *in_RSI;
  __uniq_ptr_data<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>,_true,_true>
  in_RDI;
  unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  *res;
  unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  *in_stack_ffffffffffffffc8;
  
  in_RSI[2]._M_t.
  super___uniq_ptr_impl<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  .super__Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false>._M_head_impl =
       (MultiSet<Kernel::TermList> *)
       &in_RSI[2]._M_t.
        super___uniq_ptr_impl<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false>._M_head_impl[-1]._elems.
        _end;
  std::
  unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  ::unique_ptr((unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
                *)in_RDI.
                  super___uniq_ptr_impl<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false>._M_head_impl,
               in_stack_ffffffffffffffc8);
  std::
  unique_ptr<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
  ::~unique_ptr(in_RSI);
  return (__uniq_ptr_data<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>,_true,_true>
          )(tuple<Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
            )in_RDI.
             super___uniq_ptr_impl<Kernel::MultiSet<Kernel::TermList>,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_std::default_delete<Kernel::MultiSet<Kernel::TermList>_>_>
             .super__Head_base<0UL,_Kernel::MultiSet<Kernel::TermList>_*,_false>._M_head_impl;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }